

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Functional::join<std::__cxx11::string>
          (string *__return_storage_ptr__,Functional *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list,string *sep)

{
  undefined8 *puVar1;
  ostringstream out;
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  puVar1 = *(undefined8 **)this;
  if (puVar1 != *(undefined8 **)(this + 8)) {
    do {
      if (puVar1 != *(undefined8 **)this) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   (char *)(list->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                   (long)(list->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,(char *)*puVar1,puVar1[1]);
      puVar1 = puVar1 + 4;
    } while (puVar1 != *(undefined8 **)(this + 8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

static std::string join (const std::vector<T>& list, const std::string& sep)
{
	std::ostringstream	out;

	for (typename std::vector<T>::const_iterator iter = list.begin(); iter != list.end(); iter++)
	{
		if (iter != list.begin())
			out << sep;
		out << *iter;
	}

	return out.str();
}